

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.hpp
# Opt level: O3

ssize_t __thiscall rest_rpc::rpc_client::write(rpc_client *this,int __fd,void *__buf,size_t __n)

{
  _Map_pointer ppcVar1;
  _Elt_pointer pcVar2;
  ssize_t extraout_RAX;
  size_t __n_00;
  undefined4 in_register_00000034;
  long lVar3;
  uint32_t in_R8D;
  client_message_type msg;
  unique_lock<std::mutex> lock;
  client_message_type local_48;
  unique_lock<std::mutex> local_20;
  
  local_48.req_id = CONCAT44(in_register_00000034,__fd);
  local_48.content.size_ = *(size_type *)__n;
  local_48.req_type = (request_type)__buf;
  local_48.content.data_ = *(const_pointer *)(__n + 8);
  *(undefined8 *)__n = 0;
  *(undefined8 *)(__n + 8) = 0;
  *(undefined8 *)(__n + 0x10) = 0;
  local_20._M_device = &this->write_mtx_;
  local_20._M_owns = false;
  local_48.func_id = in_R8D;
  std::unique_lock<std::mutex>::lock(&local_20);
  local_20._M_owns = true;
  pcVar2 = (this->outbox_).
           super__Deque_base<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pcVar2 == (this->outbox_).
                super__Deque_base<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
    ::_M_push_back_aux<rest_rpc::rpc_client::client_message_type>(&this->outbox_,&local_48);
    pcVar2 = (this->outbox_).
             super__Deque_base<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  }
  else {
    *(ulong *)&pcVar2->func_id = CONCAT44(local_48._36_4_,local_48.func_id);
    (pcVar2->content).data_ = local_48.content.data_;
    (pcVar2->content).size_ = local_48.content.size_;
    pcVar2->req_id = local_48.req_id;
    *(ulong *)&pcVar2->req_type = CONCAT71(local_48._9_7_,local_48.req_type);
    pcVar2 = (this->outbox_).
             super__Deque_base<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
    (this->outbox_).
    super__Deque_base<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_cur = pcVar2;
  }
  ppcVar1 = (this->outbox_).
            super__Deque_base<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  lVar3 = ((long)ppcVar1 -
           (long)(this->outbox_).
                 super__Deque_base<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
          (ulong)(ppcVar1 == (_Map_pointer)0x0);
  __n_00 = ((long)(this->outbox_).
                  super__Deque_base<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_last -
            (long)(this->outbox_).
                  super__Deque_base<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) * -0x3333333333333333 +
           ((long)pcVar2 -
            (long)(this->outbox_).
                  super__Deque_base<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * -0x3333333333333333 +
           lVar3 * 0xc;
  if (__n_00 < 2) {
    write(this,-0x33333333,(void *)(lVar3 * 3),__n_00);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return extraout_RAX;
}

Assistant:

void write(std::uint64_t req_id, request_type type,
             rpc_service::buffer_type &&message, uint32_t func_id) {
    size_t size = message.size();
    assert(size < MAX_BUF_LEN);
    client_message_type msg{req_id, type, {message.release(), size}, func_id};

    std::unique_lock<std::mutex> lock(write_mtx_);
    outbox_.emplace_back(std::move(msg));
    if (outbox_.size() > 1) {
      // outstanding async_write
      return;
    }

    write();
  }